

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  xr_file_system *this;
  xr_log *this_00;
  clock_t cVar3;
  clock_t cVar4;
  clock_t start;
  tools_base *tools;
  xr_file_system *fs;
  char *pcStack_88;
  uint fs_flags;
  char *fs_spec;
  size_t i;
  size_t num_params;
  string extension;
  uint format;
  undefined1 local_38 [8];
  cl_parser cl;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  cl.m_argc = (size_t)argv;
  cl_parser::cl_parser((cl_parser *)local_38);
  bVar1 = cl_parser::parse((cl_parser *)local_38,argc,(char **)cl.m_argc,0x25,main::options);
  if (bVar1) {
    extension.field_2._12_4_ = 0;
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-ogf");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 1;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-omf");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 2;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-dm");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 4;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-level");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 8;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-ogg2wav");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 0x10;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-dds2tga");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 0x20;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-unpack");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 0x40;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-pack");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 0x80;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-fancy");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 0x100;
    }
    bVar1 = cl_parser::exist((cl_parser *)local_38,"-xrdemo");
    if (bVar1) {
      extension.field_2._12_4_ = extension.field_2._12_4_ | 0x200;
    }
    if (extension.field_2._12_4_ == 0) {
      std::__cxx11::string::string((string *)&num_params);
      i = cl_parser::num_params((cl_parser *)local_38);
      for (fs_spec = (char *)0x0; fs_spec != (char *)i; fs_spec = fs_spec + 1) {
        pcVar2 = cl_parser::param((cl_parser *)local_38,(size_t)fs_spec);
        bVar1 = xray_re::xr_file_system::folder_exist(pcVar2);
        if (bVar1) {
          extension.field_2._12_4_ = extension.field_2._12_4_ | 0x80;
        }
        else {
          pcVar2 = cl_parser::param((cl_parser *)local_38,(size_t)fs_spec);
          xray_re::xr_file_system::split_path
                    (pcVar2,(string *)0x0,(string *)0x0,(string *)&num_params);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&num_params,".ogf");
          if (bVar1) {
            extension.field_2._12_4_ = extension.field_2._12_4_ | 1;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&num_params,".omf");
            if (bVar1) {
              extension.field_2._12_4_ = extension.field_2._12_4_ | 2;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&num_params,".dm");
              if (bVar1) {
                extension.field_2._12_4_ = extension.field_2._12_4_ | 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&num_params,".xrdemo");
                if (bVar1) {
                  extension.field_2._12_4_ = extension.field_2._12_4_ | 0x200;
                }
                else {
                  bVar1 = db_tools::is_known((string *)&num_params);
                  if (bVar1) {
                    extension.field_2._12_4_ = extension.field_2._12_4_ | 0x40;
                  }
                }
              }
            }
          }
        }
      }
      if (extension.field_2._12_4_ == 0) {
        if (i == 0) {
          usage();
        }
        else {
          xray_re::msg("can\'t auto-detect the source format");
        }
        argv_local._4_4_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&num_params);
      if (bVar1) goto LAB_0012153d;
    }
    if ((extension.field_2._12_4_ & extension.field_2._12_4_ - 1) == 0) {
      pcStack_88 = (char *)0x0;
      if ((((extension.field_2._12_4_ == 8) || (extension.field_2._12_4_ == 0x20)) ||
          (extension.field_2._12_4_ == 0x100)) || (extension.field_2._12_4_ == 0x10)) {
        bVar1 = cl_parser::get_string((cl_parser *)local_38,"-fs",&stack0xffffffffffffff78);
        if (!bVar1) {
          pcStack_88 = "fsconverter.ltx";
        }
        bVar1 = xray_re::xr_file_system::file_exist(pcStack_88);
        if (!bVar1) {
          xray_re::msg("can\'t find %s",pcStack_88);
          argv_local._4_4_ = 1;
          goto LAB_0012153d;
        }
      }
      bVar1 = cl_parser::get_bool((cl_parser *)local_38,"-ro");
      if (bVar1) {
        xray_re::msg("working in read-only mode");
      }
      fs._4_4_ = (uint)bVar1;
      this = xray_re::xr_file_system::instance();
      bVar1 = xray_re::xr_file_system::initialize(this,pcStack_88,fs._4_4_);
      if (bVar1) {
        this_00 = xray_re::xr_log::instance();
        xray_re::xr_log::init(this_00,(EVP_PKEY_CTX *)"converter");
        start = 0;
        if (extension.field_2._12_4_ == 1) {
          start = (clock_t)operator_new(0x50);
          ogf_tools::ogf_tools((ogf_tools *)start);
        }
        else if (extension.field_2._12_4_ == 2) {
          start = (clock_t)operator_new(0x50);
          omf_tools::omf_tools((omf_tools *)start);
        }
        else if (extension.field_2._12_4_ == 4) {
          start = (clock_t)operator_new(0x50);
          dm_tools::dm_tools((dm_tools *)start);
        }
        else if (extension.field_2._12_4_ == 8) {
          start = (clock_t)operator_new(0x140);
          level_tools::level_tools((level_tools *)start);
        }
        else if (extension.field_2._12_4_ == 0x10) {
          start = (clock_t)operator_new(0x28);
          ogg_tools::ogg_tools((ogg_tools *)start);
        }
        else if (extension.field_2._12_4_ == 0x20) {
          start = (clock_t)operator_new(0x30);
          dds_tools::dds_tools((dds_tools *)start);
        }
        else if (extension.field_2._12_4_ == 0x40) {
          start = (clock_t)operator_new(8);
          db_unpacker::db_unpacker((db_unpacker *)start);
        }
        else if (extension.field_2._12_4_ == 0x80) {
          start = (clock_t)operator_new(0x60);
          db_packer::db_packer((db_packer *)start);
        }
        else if (extension.field_2._12_4_ == 0x100) {
          start = (clock_t)operator_new(0x10);
          fancy_tools::fancy_tools((fancy_tools *)start);
        }
        else if (extension.field_2._12_4_ == 0x200) {
          start = (clock_t)operator_new(0x50);
          xrdemo_tools::xrdemo_tools((xrdemo_tools *)start);
        }
        if (start == 0) {
          xray_re::msg("locked");
          argv_local._4_4_ = 0;
        }
        else {
          cVar3 = clock();
          (**(code **)(*(long *)start + 0x10))(start,local_38);
          cVar4 = clock();
          xray_re::msg("total time: %.3lfs",(double)(cVar4 - cVar3) / 1000000.0);
          if (start != 0) {
            (**(code **)(*(long *)start + 8))();
          }
          argv_local._4_4_ = 0;
        }
      }
      else {
        xray_re::msg("can\'t initialize the file system");
        argv_local._4_4_ = 1;
      }
    }
    else {
      xray_re::msg("conflicting source formats");
      argv_local._4_4_ = 1;
    }
  }
  else {
    usage();
    argv_local._4_4_ = 1;
  }
LAB_0012153d:
  cl_parser::~cl_parser((cl_parser *)local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	static const cl_parser::option_desc options[] = {
		{"-ogf",	cl_parser::OT_BOOL},
		{"-omf",	cl_parser::OT_BOOL},
		{"-dm",		cl_parser::OT_BOOL},
		{"-level",	cl_parser::OT_BOOL},
		{"-ogg2wav",	cl_parser::OT_BOOL},
		{"-dds2tga",	cl_parser::OT_BOOL},
		{"-unpack",	cl_parser::OT_BOOL},
		{"-pack",	cl_parser::OT_BOOL},
		{"-xrdemo",	cl_parser::OT_BOOL},

		{"-11xx",	cl_parser::OT_BOOL},
		{"-2215",	cl_parser::OT_BOOL},
		{"-2945",	cl_parser::OT_BOOL},
		{"-2947ru",	cl_parser::OT_BOOL},
		{"-2947ww",	cl_parser::OT_BOOL},
		{"-xdb",	cl_parser::OT_BOOL},
		{"-xdb_ud",	cl_parser::OT_STRING},

		{"-info",	cl_parser::OT_BOOL},
		{"-skl",	cl_parser::OT_STRING},
		{"-skls",	cl_parser::OT_BOOL},
		{"-bones",	cl_parser::OT_BOOL},
		{"-comment",	cl_parser::OT_BOOL},
		{"-object",	cl_parser::OT_BOOL},
		{"-sg",		cl_parser::OT_STRING},

		{"-fs",		cl_parser::OT_STRING},
		{"-out",	cl_parser::OT_STRING},
		{"-dir",	cl_parser::OT_STRING},
		{"-flt",	cl_parser::OT_STRING},

		{"-ro",		cl_parser::OT_BOOL},

		{"-with_solid",	cl_parser::OT_BOOL},
		{"-with_bump",	cl_parser::OT_BOOL},

		{"-mode",	cl_parser::OT_STRING},
		{"-with_lods",	cl_parser::OT_BOOL},
		{"-dbgcfrm",	cl_parser::OT_BOOL},
		{"-dbgmrg",	cl_parser::OT_BOOL},
		{"-use_mt",	cl_parser::OT_BOOL},
		{"-terrain", cl_parser::OT_BOOL},

		{"-fancy",	cl_parser::OT_STRING},
	};

	cl_parser cl;
	if (!cl.parse(argc, argv, xr_dim(options), options)) {
		usage();
		return 1;
	}

	unsigned format = tools_base::TOOLS_AUTO;
	if (cl.exist("-ogf"))
		format |= tools_base::TOOLS_OGF;
	if (cl.exist("-omf"))
		format |= tools_base::TOOLS_OMF;
	if (cl.exist("-dm"))
		format |= tools_base::TOOLS_DM;
	if (cl.exist("-level"))
		format |= tools_base::TOOLS_LEVEL;
	if (cl.exist("-ogg2wav"))
		format |= tools_base::TOOLS_OGG;
	if (cl.exist("-dds2tga"))
		format |= tools_base::TOOLS_DDS;
	if (cl.exist("-unpack"))
		format |= tools_base::TOOLS_DB;
	if (cl.exist("-pack"))
		format |= tools_base::TOOLS_FOLDER;
	if (cl.exist("-fancy"))
		format |= tools_base::TOOLS_FANCY;
	if (cl.exist("-xrdemo"))
		format |= tools_base::TOOLS_XRDEMO;
	if (format == tools_base::TOOLS_AUTO) {
		std::string extension;
		size_t num_params = cl.num_params();
		for (size_t i = 0; i != num_params; ++i) {
			if (xr_file_system::folder_exist(cl.param(i))) {
				format |= tools_base::TOOLS_FOLDER;
			} else {
				xr_file_system::split_path(cl.param(i), 0, 0, &extension);
				if (extension == ".ogf")
					format |= tools_base::TOOLS_OGF;
				else if (extension == ".omf")
					format |= tools_base::TOOLS_OMF;
				else if (extension == ".dm")
					format |= tools_base::TOOLS_DM;
				else if (extension == ".xrdemo")
					format |= tools_base::TOOLS_XRDEMO;
				else if (db_tools::is_known(extension))
					format |= tools_base::TOOLS_DB;
			}
		}
		if (format == tools_base::TOOLS_AUTO) {
			if (num_params)
				msg("can't auto-detect the source format");
			else
				usage();
			return 1;
		}
	}
	if ((format & (format - 1)) != 0) {
		msg("conflicting source formats");
		return 1;
	}

	const char* fs_spec = 0;
	if (format == tools_base::TOOLS_LEVEL ||
			format == tools_base::TOOLS_DDS ||
			format == tools_base::TOOLS_FANCY ||
			format == tools_base::TOOLS_OGG) {
		if (!cl.get_string("-fs", fs_spec))
			fs_spec = DEFAULT_FS_SPEC;
		if (!xr_file_system::file_exist(fs_spec)) {
			msg("can't find %s", fs_spec);
			return 1;
		}
	}
	unsigned fs_flags = 0;
	if (cl.get_bool("-ro")) {
		fs_flags |= xr_file_system::FSF_READ_ONLY;
		msg("working in read-only mode");
	}
	xr_file_system& fs = xr_file_system::instance();
	if (!fs.initialize(fs_spec, fs_flags)) {
		msg("can't initialize the file system");
		return 1;
	}
	xr_log::instance().init("converter", 0);

	tools_base* tools = 0;
	switch (format) {
	case tools_base::TOOLS_OGF:
		tools = new ogf_tools;
		break;
	case tools_base::TOOLS_OMF:
		tools = new omf_tools;
		break;
	case tools_base::TOOLS_DM:
		tools = new dm_tools;
		break;
	case tools_base::TOOLS_LEVEL:
		tools = new level_tools;
		break;
	case tools_base::TOOLS_OGG:
		tools = new ogg_tools;
		break;
	case tools_base::TOOLS_DDS:
		tools = new dds_tools;
		break;
	case tools_base::TOOLS_DB:
		tools = new db_unpacker;
		break;
	case tools_base::TOOLS_FOLDER:
		tools = new db_packer;
		break;
	case tools_base::TOOLS_FANCY:
		tools = new fancy_tools;
		break;
	case tools_base::TOOLS_XRDEMO:
		tools = new xrdemo_tools;
		break;
	}
	if (tools == 0) {
		msg("locked");
		return 0;
	}

	clock_t start = clock();
	tools->process(cl);
	msg("total time: %.3lfs", (clock() - start) / 1.0 / CLOCKS_PER_SEC);

	delete tools;
	return 0;
}